

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

RefNode * __thiscall
RefTable::Get(RefTable *this,SQObject *obj,SQHash *mainpos,RefNode **prev,bool add)

{
  SQHash mainpos_00;
  SQObjectPtr *this_00;
  undefined8 *in_RCX;
  ulong *in_RDX;
  SQObject *in_RSI;
  long *in_RDI;
  byte in_R8B;
  RefNode *ref;
  SQObjectPtr *in_stack_ffffffffffffff80;
  SQObject *obj_00;
  RefTable *in_stack_ffffffffffffffa0;
  SQObjectValue in_stack_ffffffffffffffa8;
  RefTable *in_stack_ffffffffffffffb0;
  SQObject local_40;
  RefNode *local_30;
  byte local_21;
  undefined8 *local_20;
  ulong *local_18;
  SQObject *local_10;
  
  local_21 = in_R8B & 1;
  obj_00 = &local_40;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)obj_00,in_RSI);
  mainpos_00 = HashObj((SQObjectPtr *)obj_00);
  *local_18 = mainpos_00 & *in_RDI - 1U;
  ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff80);
  *local_20 = 0;
  local_30 = *(RefNode **)(in_RDI[4] + *local_18 * 8);
  while ((local_30 != (RefNode *)0x0 &&
         (((local_30->obj).super_SQObject._unVal.pTable != (local_10->_unVal).pTable ||
          ((local_30->obj).super_SQObject._type != local_10->_type))))) {
    *local_20 = local_30;
    local_30 = local_30->next;
  }
  if ((local_30 == (RefNode *)0x0) && ((local_21 & 1) != 0)) {
    if (*in_RDI == in_RDI[1]) {
      Resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8.nInteger);
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa0,local_10);
      this_00 = (SQObjectPtr *)HashObj((SQObjectPtr *)&stack0xffffffffffffffa0);
      *local_18 = (ulong)this_00 & *in_RDI - 1U;
      ::SQObjectPtr::~SQObjectPtr(this_00);
    }
    local_30 = Add(in_stack_ffffffffffffffa0,mainpos_00,obj_00);
  }
  return local_30;
}

Assistant:

RefTable::RefNode *RefTable::Get(SQObject &obj,SQHash &mainpos,RefNode **prev,bool add)
{
    RefNode *ref;
    mainpos = ::HashObj(obj)&(_numofslots-1);
    *prev = NULL;
    for (ref = _buckets[mainpos]; ref; ) {
        if(_rawval(ref->obj) == _rawval(obj) && type(ref->obj) == type(obj))
            break;
        *prev = ref;
        ref = ref->next;
    }
    if(ref == NULL && add) {
        if(_numofslots == _slotused) {
            assert(_freelist == 0);
            Resize(_numofslots*2);
            mainpos = ::HashObj(obj)&(_numofslots-1);
        }
        ref = Add(mainpos,obj);
    }
    return ref;
}